

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFForceManager::updateExcludedPotentials(SPFForceManager *this)

{
  Snapshot *this_00;
  potVec excludedPotentials;
  Vector<double,_7U> local_100;
  potVec local_c8;
  potVec local_90;
  Vector<double,_7U> local_58;
  
  Snapshot::getExcludedPotentials(&local_90,this->temporarySourceSnapshot_);
  Snapshot::getExcludedPotentials(&local_c8,this->temporarySinkSnapshot_);
  linearCombination<OpenMD::Vector<double,7u>>(&local_58,this,&local_90,&local_c8);
  this_00 = this->currentSnapshot_;
  Vector<double,_7U>::Vector(&local_100,&local_58);
  Snapshot::setExcludedPotentials(this_00,&local_100);
  return;
}

Assistant:

void SPFForceManager::updateExcludedPotentials() {
    potVec excludedPotentials =
        linearCombination(temporarySourceSnapshot_->getExcludedPotentials(),
                          temporarySinkSnapshot_->getExcludedPotentials());
    currentSnapshot_->setExcludedPotentials(excludedPotentials);
  }